

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::UnaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::UnaryOp>::
add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
          (FeatureOptions<wasm::UnaryOp> *this,FeatureSet feature,UnaryOp option,UnaryOp rest,
          UnaryOp rest_1,UnaryOp rest_2,UnaryOp rest_3,UnaryOp rest_4,UnaryOp rest_5,UnaryOp rest_6,
          UnaryOp rest_7,UnaryOp rest_8,UnaryOp rest_9,UnaryOp rest_10,UnaryOp rest_11,
          UnaryOp rest_12,UnaryOp rest_13,UnaryOp rest_14,UnaryOp rest_15,UnaryOp rest_16,
          UnaryOp rest_17,UnaryOp rest_18,UnaryOp rest_19,UnaryOp rest_20,UnaryOp rest_21,
          UnaryOp rest_22,UnaryOp rest_23,UnaryOp rest_24,UnaryOp rest_25,UnaryOp rest_26,
          UnaryOp rest_27,UnaryOp rest_28,UnaryOp rest_29,UnaryOp rest_30,UnaryOp rest_31,
          UnaryOp rest_32,UnaryOp rest_33,UnaryOp rest_34,UnaryOp rest_35,UnaryOp rest_36,
          UnaryOp rest_37,UnaryOp rest_38,UnaryOp rest_39,UnaryOp rest_40,UnaryOp rest_41,
          UnaryOp rest_42,UnaryOp rest_43,UnaryOp rest_44,UnaryOp rest_45,UnaryOp rest_46,
          UnaryOp rest_47)

{
  iterator __position;
  vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *this_00;
  FeatureOptions<wasm::UnaryOp> *pFVar1;
  key_type local_3c;
  UnaryOp local_38;
  FeatureSet feature_local;
  UnaryOp option_local;
  
  local_3c.features = feature.features;
  local_38 = option;
  feature_local.features = rest_2;
  this_00 = (vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
            ::operator[](&this->options,&local_3c);
  __position._M_current = *(UnaryOp **)(this_00 + 8);
  if (__position._M_current == *(UnaryOp **)(this_00 + 0x10)) {
    std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>::
    _M_realloc_insert<wasm::UnaryOp_const&>(this_00,__position,&local_38);
  }
  else {
    *__position._M_current = option;
    *(UnaryOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (this,(FeatureSet)local_3c.features,rest,rest_1,feature_local.features,rest_3,
                      rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,
                      rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,rest_20,rest_21,rest_22,
                      rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30,rest_31,
                      rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
                      rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }